

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_unittest.cc
# Opt level: O2

void gflags::anon_unknown_5::Test_FlagSaverTest_CanSaveVariousTypedFlagValues::Run(void)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  FlagSaver fs;
  FlagSaver fs_1;
  
  FlagSaver::FlagSaver(&fs);
  fprintf(_stderr,"Running test %s/%s\n","FlagSaverTest","CanSaveVariousTypedFlagValues");
  fLI::FLAGS_test_int32 = 0xffffffff;
  fLB::FLAGS_test_bool = 0;
  fLU::FLAGS_test_uint32 = 2;
  fLI64::FLAGS_test_int64 = 0xfffffffffffffffd;
  fLU64::FLAGS_test_uint64 = 4;
  fLD::FLAGS_test_double = 5.0;
  std::__cxx11::string::assign((char *)fLS::FLAGS_test_string_abi_cxx11_);
  FlagSaver::FlagSaver(&fs_1);
  fLB::FLAGS_test_bool = '\x01';
  fLI::FLAGS_test_int32 = -5;
  fLU::FLAGS_test_uint32 = 6;
  fLI64::FLAGS_test_int64 = -7;
  fLU64::FLAGS_test_uint64 = 8;
  fLD::FLAGS_test_double = 8.0;
  std::__cxx11::string::assign((char *)fLS::FLAGS_test_string_abi_cxx11_);
  FlagSaver::~FlagSaver(&fs_1);
  if (fLB::FLAGS_test_bool == '\x01') {
    fprintf(_stderr,"Check failed: %s\n","!(FLAGS_test_bool)");
    goto LAB_00136568;
  }
  if (fLI::FLAGS_test_int32 == -1) {
    if (fLU::FLAGS_test_uint32 == 2) {
      if (fLI64::FLAGS_test_int64 == -3) {
        if (fLU64::FLAGS_test_uint64 == 4) {
          if (fLD::FLAGS_test_double + -0.001 <= 5.0) {
            if (5.0 <= fLD::FLAGS_test_double + 0.001) {
              bVar1 = std::operator==("good",fLS::FLAGS_test_string_abi_cxx11_);
              if (bVar1) {
                FlagSaver::~FlagSaver(&fs);
                return;
              }
              pcVar2 = "\"good\"";
              pcVar3 = "FLAGS_test_string";
              goto LAB_00136561;
            }
          }
          fprintf(_stderr,"Check failed: %s == %s\n","5.0","FLAGS_test_double");
          goto LAB_00136568;
        }
        pcVar2 = "4";
        pcVar3 = "FLAGS_test_uint64";
      }
      else {
        pcVar2 = "-3";
        pcVar3 = "FLAGS_test_int64";
      }
    }
    else {
      pcVar2 = "2";
      pcVar3 = "FLAGS_test_uint32";
    }
  }
  else {
    pcVar2 = "-1";
    pcVar3 = "FLAGS_test_int32";
  }
LAB_00136561:
  fprintf(_stderr,"Check failed: %s %s %s\n",pcVar2,"==",pcVar3);
LAB_00136568:
  exit(1);
}

Assistant:

TEST(FlagSaverTest, CanSaveVariousTypedFlagValues) {
  // Initializes the flags.
  FLAGS_test_bool = false;
  FLAGS_test_int32 = -1;
  FLAGS_test_uint32 = 2;
  FLAGS_test_int64 = -3;
  FLAGS_test_uint64 = 4;
  FLAGS_test_double = 5.0;
  FLAGS_test_string = "good";

  // Saves the flag states.
  {
    FlagSaver fs;

    // Modifies the flags.
    FLAGS_test_bool = true;
    FLAGS_test_int32 = -5;
    FLAGS_test_uint32 = 6;
    FLAGS_test_int64 = -7;
    FLAGS_test_uint64 = 8;
    FLAGS_test_double = 8.0;
    FLAGS_test_string = "bad";

    // Restores the flag states.
  }

  // Verifies the flag values were restored.
  EXPECT_FALSE(FLAGS_test_bool);
  EXPECT_EQ(-1, FLAGS_test_int32);
  EXPECT_EQ(2, FLAGS_test_uint32);
  EXPECT_EQ(-3, FLAGS_test_int64);
  EXPECT_EQ(4, FLAGS_test_uint64);
  EXPECT_DOUBLE_EQ(5.0, FLAGS_test_double);
  EXPECT_EQ("good", FLAGS_test_string);
}